

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O3

bool duckdb::ParsedExpressionIsAggregate(Binder *binder,ParsedExpression *expr)

{
  FunctionExpression *pFVar1;
  bool is_aggregate;
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if ((expr->super_BaseExpression).expression_class == FUNCTION) {
    pFVar1 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)&local_40,AGGREGATE_FUNCTION_ENTRY,&pFVar1->function_name,
               (QueryErrorContext)0xffffffffffffffff);
    local_48 = CatalogEntryRetriever::GetEntry
                         (&binder->entry_retriever,&pFVar1->catalog,&pFVar1->schema,
                          (EntryLookupInfo *)&local_40,RETURN_NULL);
    if ((local_48.ptr != (CatalogEntry *)0x0) &&
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_48),
       (local_48.ptr)->type == AGGREGATE_FUNCTION_ENTRY)) {
      return true;
    }
  }
  local_48.ptr = local_48.ptr & 0xffffffffffffff00;
  local_28 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
             ::_M_manager;
  local_40._M_unused._M_object = &local_48;
  local_40._8_8_ = binder;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  return (bool)local_48.ptr._0_1_;
}

Assistant:

static bool ParsedExpressionIsAggregate(Binder &binder, const ParsedExpression &expr) {
	if (expr.GetExpressionClass() == ExpressionClass::FUNCTION) {
		auto &function = expr.Cast<FunctionExpression>();
		QueryErrorContext error_context;

		EntryLookupInfo lookup_info(CatalogType::AGGREGATE_FUNCTION_ENTRY, function.function_name, error_context);
		auto entry =
		    binder.GetCatalogEntry(function.catalog, function.schema, lookup_info, OnEntryNotFound::RETURN_NULL);
		if (entry && entry->type == CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			return true;
		}
	}
	bool is_aggregate = false;
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { is_aggregate |= ParsedExpressionIsAggregate(binder, child); });
	return is_aggregate;
}